

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t iVar6;
  ulong uVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  undefined4 in_register_00000084;
  longlong lVar8;
  undefined4 in_register_0000008c;
  longlong lVar9;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i a_20;
  __m128i a_21;
  __m128i a_22;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i alVar10;
  __m128i alVar11;
  __m128i alVar12;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  int local_73c;
  long local_738;
  int local_71c;
  long local_718;
  int local_6f8;
  int local_6f4;
  ulong *puStack_6f0;
  int32_t k;
  int64_t *j_1;
  int64_t *i_1;
  int64_t *t;
  __m128i cond_Jlt;
  __m128i cond_all;
  __m128i cond_max;
  __m128i cond_eq;
  __m128i cond_valid_IJ;
  __m128i cond_valid_J;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIltLimit;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vJLimit;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vMaxH;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vN;
  __m128i vOne;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf0;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  long local_4a0;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int64_t *F_pr;
  int64_t *H_pr;
  int64_t *s2;
  int64_t *_F_pr;
  int64_t *_H_pr;
  int64_t *s2B;
  int64_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  
  lVar9 = CONCAT44(in_register_0000008c,gap);
  lVar8 = CONCAT44(in_register_00000084,open);
  s2B = (int64_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_sse2_128_64","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_diag_sse2_128_64","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_diag_sse2_128_64","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_diag_sse2_128_64","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_sse2_128_64","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_sse2_128_64","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_diag_sse2_128_64","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_6f8 = _s1Len;
    if (matrix->type != 0) {
      local_6f8 = matrix->length;
    }
    NEG_LIMIT._4_4_ = 0;
    NEG_LIMIT._0_4_ = 0;
    if (-open < matrix->min) {
      alVar10[1] = (long)open;
    }
    else {
      alVar10[1] = -(long)matrix->min;
    }
    local_4a0 = alVar10[1] + -0x7fffffffffffffff;
    vILimit[0] = (longlong)local_6f8;
    vILimit[1] = local_4a0;
    vEndJ[0] = local_4a0;
    vEndJ[1] = local_4a0;
    vEndI[0] = local_4a0;
    vEndI[1] = local_4a0;
    _s1_local = (char *)parasail_result_new();
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x2801004;
      ptr = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_00 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      alVar11[1] = (size_t)(s2Len + 2);
      alVar12[0] = 0x10;
      ptr_01 = parasail_memalign_int64_t(0x10,alVar11[1]);
      if (ptr == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        alVar10[1] = extraout_RDX;
        if (matrix->type == 0) {
          alVar11[1] = (size_t)(local_6f8 + 1);
          alVar12[0] = 0x10;
          s2B = parasail_memalign_int64_t(0x10,alVar11[1]);
          if (s2B == (int64_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          alVar10[1] = extraout_RDX_00;
          for (end_query = 0; end_query < local_6f8; end_query = end_query + 1) {
            alVar10[1] = (long)matrix->mapper[(byte)_s1[end_query]];
            s2B[end_query] = alVar10[1];
          }
          for (end_query = local_6f8; end_query < local_6f8 + 1; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          alVar10[1] = (long)matrix->mapper[(byte)_s2[end_ref]];
          ptr[(long)end_ref + 1] = alVar10[1];
        }
        for (end_ref = -1; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 1] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 1) {
          ptr[(long)end_ref + 1] = 0;
          iVar1 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 1] = 0;
          ptr_01[(long)end_ref + 1] = local_4a0;
          alVar10[1] = local_4a0;
        }
        for (end_ref = -1; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 1] = local_4a0;
          ptr_01[(long)end_ref + 1] = local_4a0;
          alVar10[1] = local_4a0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 1) {
          ptr_00[(long)end_ref + 1] = local_4a0;
          ptr_01[(long)end_ref + 1] = local_4a0;
          alVar10[1] = local_4a0;
          iVar1 = end_ref + 1;
        }
        for (end_query = 0; uVar7 = (ulong)(s2Len + 1), end_query < local_6f8;
            end_query = end_query + 2) {
          piVar2 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_718 = s2B[end_query];
          }
          else {
            if (end_query < local_6f8) {
              local_71c = end_query;
            }
            else {
              local_71c = local_6f8 + -1;
            }
            local_718 = (long)local_71c;
          }
          if (matrix->type == 0) {
            local_738 = s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_6f8) {
              local_73c = end_query + 1;
            }
            else {
              local_73c = local_6f8 + -1;
            }
            local_738 = (long)local_73c;
          }
          b[1] = matrix->size * local_738 * 4;
          a[1] = alVar11[1];
          a[0] = alVar12[0];
          b[0] = local_738;
          alVar10 = _mm_cmplt_epi64_rpl(a,b);
          for (end_ref = 0; end_ref < s2Len + 1; end_ref = end_ref + 1) {
            a_00[1] = 1;
            a_00[0] = ptr_00[(long)end_ref + 1];
            alVar11 = _mm_insert_epi64_rpl(a_00,alVar10[1],end_ref);
            alVar10[1] = (long)end_ref;
            iVar6 = ptr_01[alVar10[1] + 1];
            a_01[1]._0_4_ = 1;
            a_01[0] = iVar6;
            a_01[1]._4_4_ = 0;
            alVar12[0] = 1;
            alVar11 = _mm_insert_epi64_rpl(a_01,alVar11[1],end_ref);
            b_00[0] = alVar11[1];
            a_02[1] = alVar12[0];
            a_02[0] = iVar6;
            b_00[1] = alVar10[1];
            alVar11 = _mm_max_epi64_rpl(a_02,b_00);
            b_01[0] = alVar11[1];
            a_03[1] = alVar12[0];
            a_03[0] = iVar6;
            b_01[1] = alVar10[1];
            _mm_max_epi64_rpl(a_03,b_01);
            alVar10[1] = (long)piVar2[iVar1 * local_718 + ptr[(long)end_ref + 1]];
            alVar11[1] = (size_t)(end_ref + -1);
            alVar11[0] = iVar6;
            alVar10[0] = ptr[alVar11[1] + 1];
            alVar12 = _mm_max_epi64_rpl(alVar11,alVar10);
            b_02[0] = alVar12[1];
            a_04[1] = alVar11[1];
            a_04[0] = iVar6;
            b_02[1] = alVar10[1];
            alVar12 = _mm_max_epi64_rpl(a_04,b_02);
            b_03[0] = alVar12[1];
            a_05[1] = alVar11[1];
            a_05[0] = iVar6;
            b_03[1] = alVar10[1];
            alVar12 = _mm_max_epi64_rpl(a_05,b_03);
            b_04[0] = alVar12[1];
            a_06[1] = alVar11[1];
            a_06[0] = iVar6;
            b_04[1] = alVar10[1];
            alVar12 = _mm_cmpeq_epi64_rpl(a_06,b_04);
            b_05[0] = alVar12[1];
            a_07[1] = alVar11[1];
            a_07[0] = iVar6;
            b_05[1] = alVar10[1];
            mask[1] = lVar9;
            mask[0] = lVar8;
            alVar12 = _mm_blendv_epi8_rpl(a_07,b_05,mask);
            b_06[0] = alVar12[1];
            a_08[1] = alVar11[1];
            a_08[0] = iVar6;
            b_06[1] = alVar10[1];
            mask_00[1] = lVar9;
            mask_00[0] = lVar8;
            alVar12 = _mm_blendv_epi8_rpl(a_08,b_06,mask_00);
            alVar12[0] = alVar12[1];
            if (1 < end_ref) {
              a_09[1] = alVar11[1];
              a_09[0] = iVar6;
              alVar12[1] = alVar10[1];
              alVar12 = _mm_min_epi64_rpl(a_09,alVar12);
              b_07[0] = alVar12[1];
              a_10[1] = alVar11[1];
              a_10[0] = iVar6;
              b_07[1] = alVar10[1];
              alVar10 = _mm_max_epi64_rpl(a_10,b_07);
              alVar12[0] = alVar10[1];
            }
            auVar3._8_8_ = 0;
            auVar3._0_8_ = alVar11[1];
            iVar6 = _mm_extract_epi64_rpl((__m128i)(auVar3 << 0x40),(int)alVar12[0]);
            ptr_00[(long)(end_ref + -1) + 1] = iVar6;
            alVar12[0] = 0;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = alVar11[1];
            iVar6 = _mm_extract_epi64_rpl((__m128i)(auVar4 << 0x40),(int)iVar6);
            b_08[1] = (long)(end_ref + -1);
            ptr_01[b_08[1] + 1] = iVar6;
            a_11[1] = alVar11[1];
            a_11[0] = alVar12[0];
            b_08[0] = iVar6;
            alVar10 = _mm_cmpgt_epi64_rpl(a_11,b_08);
            b_09[0] = alVar10[1];
            a_12[1] = alVar11[1];
            a_12[0] = alVar12[0];
            b_09[1] = b_08[1];
            alVar10 = _mm_cmplt_epi64_rpl(a_12,b_09);
            b_10[0] = alVar10[1];
            a_13[1] = alVar11[1];
            a_13[0] = alVar12[0];
            b_10[1] = b_08[1];
            alVar10 = _mm_cmpeq_epi64_rpl(a_13,b_10);
            b_11[0] = alVar10[1];
            a_14[1] = alVar11[1];
            a_14[0] = alVar12[0];
            b_11[1] = b_08[1];
            alVar10 = _mm_cmpgt_epi64_rpl(a_14,b_11);
            b_12[0] = alVar10[1];
            a_15[1] = alVar11[1];
            a_15[0] = alVar12[0];
            b_12[1] = b_08[1];
            alVar10 = _mm_cmplt_epi64_rpl(a_15,b_12);
            b_13[0] = alVar10[1];
            a_16[1] = alVar11[1];
            a_16[0] = alVar12[0];
            b_13[1] = b_08[1];
            mask_01[1] = lVar9;
            mask_01[0] = lVar8;
            alVar10 = _mm_blendv_epi8_rpl(a_16,b_13,mask_01);
            b_14[0] = alVar10[1];
            a_17[1] = alVar11[1];
            a_17[0] = alVar12[0];
            b_14[1] = b_08[1];
            mask_02[1] = lVar9;
            mask_02[0] = lVar8;
            vEndI[1] = extraout_XMM0_Qa;
            alVar10 = _mm_blendv_epi8_rpl(a_17,b_14,mask_02);
            b_15[0] = alVar10[1];
            a_18[1] = alVar11[1];
            a_18[0] = alVar12[0];
            b_15[1] = b_08[1];
            mask_03[1] = lVar9;
            mask_03[0] = lVar8;
            alVar10 = _mm_blendv_epi8_rpl(a_18,b_15,mask_03);
            b_16[0] = alVar10[1];
            a_19[1] = alVar11[1];
            a_19[0] = alVar12[0];
            b_16[1] = b_08[1];
            mask_04[1] = lVar9;
            mask_04[0] = lVar8;
            alVar10 = _mm_blendv_epi8_rpl(a_19,b_16,mask_04);
            b_17[0] = alVar10[1];
            a_20[1] = alVar11[1];
            a_20[0] = alVar12[0];
            b_17[1] = b_08[1];
            mask_05[1] = lVar9;
            mask_05[0] = lVar8;
            vEndJ[1] = extraout_XMM0_Qa_00;
            vEndI[0] = extraout_XMM0_Qb;
            alVar10 = _mm_blendv_epi8_rpl(a_20,b_17,mask_05);
            vILimit[1] = extraout_XMM0_Qa_01;
            vEndJ[0] = extraout_XMM0_Qb_00;
          }
        }
        i_1 = vEndI;
        j_1 = vEndJ;
        puStack_6f0 = (ulong *)vILimit;
        local_6f4 = 0;
        while( true ) {
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          puStack_6f0 = puStack_6f0 + 1;
          if (1 < local_6f4) break;
          if (local_4a0 < *i_1) {
            local_4a0 = *i_1;
            NEG_LIMIT._4_4_ = (int)*j_1;
            NEG_LIMIT._0_4_ = (int)*puStack_6f0;
          }
          else if (*i_1 == local_4a0) {
            uVar7 = (ulong)(int)NEG_LIMIT;
            if ((long)*puStack_6f0 < (long)uVar7) {
              NEG_LIMIT._4_4_ = (int)*j_1;
              NEG_LIMIT._0_4_ = (int)*puStack_6f0;
            }
            else {
              uVar7 = (ulong)(int)NEG_LIMIT;
              if ((*puStack_6f0 == uVar7) && (uVar7 = (ulong)NEG_LIMIT._4_4_, *j_1 < (long)uVar7)) {
                NEG_LIMIT._4_4_ = (int)*j_1;
                NEG_LIMIT._0_4_ = (int)*puStack_6f0;
              }
            }
          }
          local_6f4 = local_6f4 + 1;
        }
        a_21[1] = alVar11[1];
        a_21[0] = alVar12[0];
        b_18[1] = uVar7;
        b_18[0] = alVar10[1];
        alVar10 = _mm_cmplt_epi64_rpl(a_21,b_18);
        b_19[0] = alVar10[1];
        a_22[1] = alVar11[1];
        a_22[0] = alVar12[0];
        b_19[1] = uVar7;
        _mm_cmpgt_epi64_rpl(a_22,b_19);
        uVar7 = extraout_XMM0_Qb_01 | extraout_XMM0_Qb_02;
        auVar5._8_8_ = uVar7;
        auVar5._0_8_ = extraout_XMM0_Qa_02 | extraout_XMM0_Qa_03;
        if ((((((((((((((((auVar5 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar5 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar5 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar5 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar5 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar5 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar5 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar5 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar7 >> 7 & 1) != 0) || (uVar7 >> 0xf & 1) != 0) || (uVar7 >> 0x17 & 1) != 0) ||
               (uVar7 >> 0x1f & 1) != 0) || (uVar7 >> 0x27 & 1) != 0) || (uVar7 >> 0x2f & 1) != 0)
            || (uVar7 >> 0x37 & 1) != 0) || (long)uVar7 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_4a0 = 0;
          NEG_LIMIT._4_4_ = 0;
          NEG_LIMIT._0_4_ = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)local_4a0;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT._4_4_;
        ((parasail_result_t *)_s1_local)->end_ref = (int)NEG_LIMIT;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64_rpl(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}